

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Serializer::ValidateWriterRec
          (BP5Serializer *this,BP5WriterRec Rec,void *Variable)

{
  long *plVar1;
  char *pcVar2;
  long lVar3;
  bool bVar4;
  allocator local_94;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  Rec->Key = Variable;
  plVar1 = *(long **)((long)Variable + 0xd8);
  pcVar2 = Rec->OperatorType;
  if (*(long **)((long)Variable + 0xe0) == plVar1) {
    if (pcVar2 == (char *)0x0) {
      return;
    }
    std::__cxx11::string::string((string *)&local_70,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_90,"format::BP5Serializer",&local_92);
    std::__cxx11::string::string((string *)&local_30,"Marshal",&local_93);
    std::__cxx11::string::string
              ((string *)&local_50,"BP5 does not support removing operators after the first Put()",
               &local_94);
    helper::Throw<std::logic_error>(&local_70,&local_90,&local_30,&local_50,-1);
  }
  else if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_70,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_90,"format::BP5Serializer",&local_92);
    std::__cxx11::string::string((string *)&local_30,"Marshal",&local_93);
    std::__cxx11::string::string
              ((string *)&local_50,"BP5 does not support adding operators after the first Put()",
               &local_94);
    helper::Throw<std::logic_error>(&local_70,&local_90,&local_30,&local_50,-1);
  }
  else if ((ulong)((long)*(long **)((long)Variable + 0xe0) - (long)plVar1) < 0x11) {
    lVar3 = *plVar1;
    std::__cxx11::string::string((string *)&local_70,pcVar2,(allocator *)&local_90);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar3 + 8),&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar4) {
      return;
    }
    std::__cxx11::string::string((string *)&local_70,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_90,"format::BP5Serializer",&local_92);
    std::__cxx11::string::string((string *)&local_30,"Marshal",&local_93);
    std::__cxx11::string::string
              ((string *)&local_50,"BP5 does not support changing operators after the first Put()",
               &local_94);
    helper::Throw<std::logic_error>(&local_70,&local_90,&local_30,&local_50,-1);
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"Toolkit",&local_91);
    std::__cxx11::string::string((string *)&local_90,"format::BP5Serializer",&local_92);
    std::__cxx11::string::string((string *)&local_30,"Marshal",&local_93);
    std::__cxx11::string::string
              ((string *)&local_50,"BP5 does not support multiple operators",&local_94);
    helper::Throw<std::logic_error>(&local_70,&local_90,&local_30,&local_50,-1);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void BP5Serializer::ValidateWriterRec(BP5Serializer::BP5WriterRec Rec, void *Variable)
{
    core::VariableBase *VB = static_cast<core::VariableBase *>(Variable);

    Rec->Key = Variable; // reset this, because Variable might have been destroyed and recreated
    if ((VB->m_Operations.size() == 0) && Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support removing operators after the first Put()");
    }
    else if ((VB->m_Operations.size() > 0) && !Rec->OperatorType)
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support adding operators after the first Put()");
    }
    else if (VB->m_Operations.size() > 1)
    {
        // removed operator case
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "Marshal",
                                        "BP5 does not support multiple operators");
    }
    else if (Rec->OperatorType && VB->m_Operations.size() &&
             (VB->m_Operations[0]->m_TypeString != std::string(Rec->OperatorType)))
    {
        // removed operator case
        helper::Throw<std::logic_error>(
            "Toolkit", "format::BP5Serializer", "Marshal",
            "BP5 does not support changing operators after the first Put()");
    }
}